

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

bool re2::IsAnchorEnd(Regexp **pre,int depth)

{
  undefined1 auVar1 [16];
  bool bVar2;
  RegexpOp RVar3;
  int iVar4;
  ParseFlags PVar5;
  ulong uVar6;
  Regexp **sub_00;
  Regexp **ppRVar7;
  Regexp *pRVar8;
  int local_3c;
  int i;
  Regexp **subcopy;
  Regexp *sub;
  Regexp *re;
  Regexp **ppRStack_18;
  int depth_local;
  Regexp **pre_local;
  
  sub = *pre;
  if ((sub != (Regexp *)0x0) && (depth < 4)) {
    re._4_4_ = depth;
    ppRStack_18 = pre;
    RVar3 = Regexp::op(sub);
    if (RVar3 == kRegexpConcat) {
      iVar4 = Regexp::nsub(sub);
      if (0 < iVar4) {
        ppRVar7 = Regexp::sub(sub);
        iVar4 = Regexp::nsub(sub);
        subcopy = (Regexp **)Regexp::Incref(ppRVar7[iVar4 + -1]);
        bVar2 = IsAnchorEnd((Regexp **)&subcopy,re._4_4_ + 1);
        if (bVar2) {
          iVar4 = Regexp::nsub(sub);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (long)iVar4;
          uVar6 = SUB168(auVar1 * ZEXT816(8),0);
          if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
            uVar6 = 0xffffffffffffffff;
          }
          sub_00 = (Regexp **)operator_new__(uVar6);
          ppRVar7 = subcopy;
          iVar4 = Regexp::nsub(sub);
          sub_00[iVar4 + -1] = (Regexp *)ppRVar7;
          for (local_3c = 0; iVar4 = Regexp::nsub(sub), local_3c < iVar4 + -1;
              local_3c = local_3c + 1) {
            ppRVar7 = Regexp::sub(sub);
            pRVar8 = Regexp::Incref(ppRVar7[local_3c]);
            sub_00[local_3c] = pRVar8;
          }
          iVar4 = Regexp::nsub(sub);
          PVar5 = Regexp::parse_flags(sub);
          pRVar8 = Regexp::Concat(sub_00,iVar4,PVar5);
          *ppRStack_18 = pRVar8;
          if (sub_00 != (Regexp **)0x0) {
            operator_delete__(sub_00);
          }
          Regexp::Decref(sub);
          return true;
        }
        Regexp::Decref((Regexp *)subcopy);
      }
    }
    else if (RVar3 == kRegexpCapture) {
      ppRVar7 = Regexp::sub(sub);
      subcopy = (Regexp **)Regexp::Incref(*ppRVar7);
      bVar2 = IsAnchorEnd((Regexp **)&subcopy,re._4_4_ + 1);
      ppRVar7 = subcopy;
      if (bVar2) {
        PVar5 = Regexp::parse_flags(sub);
        iVar4 = Regexp::cap(sub);
        pRVar8 = Regexp::Capture((Regexp *)ppRVar7,PVar5,iVar4);
        *ppRStack_18 = pRVar8;
        Regexp::Decref(sub);
        return true;
      }
      Regexp::Decref((Regexp *)subcopy);
    }
    else if (RVar3 == kRegexpEndText) {
      PVar5 = Regexp::parse_flags(sub);
      pRVar8 = Regexp::LiteralString((Rune *)0x0,0,PVar5);
      *ppRStack_18 = pRVar8;
      Regexp::Decref(sub);
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

static bool IsAnchorEnd(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorEnd is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[re->nsub() - 1]->Incref();
        if (IsAnchorEnd(&sub, depth+1)) {
          Regexp** subcopy = new Regexp*[re->nsub()];
          subcopy[re->nsub() - 1] = sub;  // already have reference
          for (int i = 0; i < re->nsub() - 1; i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy, re->nsub(), re->parse_flags());
          delete[] subcopy;
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorEnd(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpEndText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}